

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::forward_int8_x86
          (ConvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  int *piVar3;
  Layer *pLVar4;
  float fVar5;
  undefined1 uVar6;
  undefined3 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  int iVar11;
  undefined1 uVar12;
  uint uVar13;
  _func_int *p_Var14;
  _func_int **pp_Var15;
  int iVar16;
  undefined4 *puVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  float fVar22;
  iterator iVar23;
  pointer pfVar24;
  int iVar25;
  Option *_elemsize;
  undefined1 (*pauVar26) [16];
  uint _elempack;
  Option *opt_00;
  long lVar27;
  int iVar28;
  undefined1 (*pauVar29) [16];
  void *pvVar30;
  ulong uVar31;
  long lVar32;
  int iVar33;
  ulong uVar34;
  bool bVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  float fVar71;
  float fVar85;
  float fVar87;
  __m128 min;
  undefined1 auVar72 [16];
  float fVar89;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar86;
  float fVar88;
  float fVar90;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  __m128 max;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar119;
  float fVar121;
  float fVar122;
  v4sf one;
  float fVar123;
  undefined1 auVar120 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Option opt_g;
  float *local_300;
  undefined1 local_2f8 [40];
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  int iStack_2c0;
  undefined4 uStack_2bc;
  size_t local_2b8;
  ulong local_2b0;
  float *local_2a8;
  void *local_2a0;
  void *local_298;
  ulong local_290;
  Mat local_288;
  ulong local_238;
  _func_int **local_230;
  Mat local_228;
  long local_1e0;
  ulong local_1d8;
  pointer local_1d0;
  int *local_1c8;
  Allocator *local_1c0;
  int local_1b8;
  Allocator *local_1b0;
  undefined4 local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  int local_198;
  ulong local_190;
  void *local_188;
  int *local_180;
  ulong local_178;
  int local_170;
  Allocator *local_168;
  undefined4 local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  ulong local_148;
  size_type local_140;
  Mat local_138;
  undefined1 local_e8 [16];
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  local_138.c = bottom_blob->c;
  local_138.elempack = bottom_blob->elempack;
  local_138.elemsize = bottom_blob->elemsize;
  pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx;
  p_Var14 = pp_Var15[-3];
  iVar16 = *(int *)(&this->field_0xd4 + (long)p_Var14);
  iVar28 = *(int *)(&this->field_0xd8 + (long)p_Var14);
  iVar21 = *(int *)(&this->field_0xdc + (long)p_Var14);
  iVar33 = *(int *)(&this->field_0xe0 + (long)p_Var14);
  piVar3 = bottom_blob->refcount;
  local_138.data = bottom_blob->data;
  local_138.refcount = bottom_blob->refcount;
  local_138.allocator = bottom_blob->allocator;
  local_138.dims = bottom_blob->dims;
  local_138.w = bottom_blob->w;
  local_138.h = bottom_blob->h;
  local_138.d = bottom_blob->d;
  local_138.cstep = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
    pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx;
  }
  if (local_138.elempack == 0 || ((int)local_138.elemsize * 8) / local_138.elempack != 8) {
    uVar34 = (long)(local_138.elempack * local_138.c) /
             (long)*(int *)(&this->field_0x108 + (long)pp_Var15[-3]);
    local_228.cstep = 0;
    local_228.data = (undefined4 *)0x0;
    local_228.refcount._0_4_ = 0;
    local_228.refcount._4_4_ = 0;
    local_228.elemsize = 0;
    local_228.elempack = 0;
    local_228.allocator = (Allocator *)0x0;
    local_228.dims = 0;
    local_228.w = 0;
    local_228.h = 0;
    local_228.d = 0;
    local_228.c = 0;
    Mat::create(&local_228,local_138.elempack * local_138.c,4,(Allocator *)0x0);
    pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx;
    p_Var14 = pp_Var15[-3];
    if (0 < *(int *)(&this->field_0x108 + (long)p_Var14)) {
      lVar27 = 0;
      puVar17 = (undefined4 *)local_228.data;
      do {
        if (0 < (int)uVar34) {
          uVar2 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)p_Var14) + lVar27 * 4);
          uVar31 = uVar34 & 0xffffffff;
          do {
            *puVar17 = uVar2;
            puVar17 = puVar17 + 1;
            uVar20 = (int)uVar31 - 1;
            uVar31 = (ulong)uVar20;
          } while (uVar20 != 0);
          p_Var14 = pp_Var15[-3];
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 < *(int *)(&this->field_0x108 + (long)p_Var14));
    }
    uVar6 = opt->lightmode;
    uVar7 = *(undefined3 *)&opt->field_0x1;
    uVar8 = opt->num_threads;
    local_2f8._4_4_ = uVar8;
    local_2f8._1_3_ = uVar7;
    local_2f8[0] = uVar6;
    local_2f8._16_8_ = opt->workspace_allocator;
    local_2f8._24_4_ = opt->openmp_blocktime;
    local_2f8[0x1c] = opt->use_winograd_convolution;
    local_2f8[0x1d] = opt->use_sgemm_convolution;
    local_2f8[0x1e] = opt->use_int8_inference;
    local_2f8[0x1f] = opt->use_vulkan_compute;
    local_2f8[0x20] = opt->use_bf16_storage;
    local_2f8[0x21] = opt->use_fp16_packed;
    local_2f8[0x22] = opt->use_fp16_storage;
    local_2f8[0x23] = opt->use_fp16_arithmetic;
    local_2f8[0x24] = opt->use_int8_packed;
    local_2f8[0x25] = opt->use_int8_storage;
    local_2f8[0x26] = opt->use_int8_arithmetic;
    local_2f8[0x27] = opt->use_packing_layout;
    unique0x00006d08 = opt->use_shader_pack8;
    unique0x00006d09 = opt->use_subgroup_basic;
    unique0x00006d0a = opt->use_subgroup_vote;
    unique0x00006d0b = opt->use_subgroup_ballot;
    unique0x00006d0c = opt->use_subgroup_shuffle;
    unique0x00006d0d = opt->use_image_storage;
    unique0x00006d0e = opt->use_tensor_storage;
    unique0x00006d0f = opt->use_weight_fp16_storage;
    uStack_2c8._0_4_ = opt->flush_denormals;
    unique0x00006d14 = opt->use_local_pool_allocator;
    unique0x00006d15 = opt->use_reserved_1;
    unique0x00006d16 = opt->use_reserved_2;
    unique0x00006d17 = opt->use_reserved_3;
    unique0x00006d18 = opt->use_reserved_4;
    unique0x00006d19 = opt->use_reserved_5;
    unique0x00006d1a = opt->use_reserved_6;
    unique0x00006d1b = opt->use_reserved_7;
    unique0x00006d1c = opt->use_reserved_8;
    unique0x00006d1d = opt->use_reserved_9;
    unique0x00006d1e = opt->use_reserved_10;
    unique0x00006d1f = opt->use_reserved_11;
    local_2f8._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_138,&local_228,(Option *)local_2f8);
    piVar3 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_228.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_228.data != (undefined4 *)0x0) {
            free(local_228.data);
          }
        }
        else {
          (*(local_228.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx;
  }
  local_228.cstep = 0;
  local_228.data = (void *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize = 0;
  local_228.elempack = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx + (long)pp_Var15[-3]),&local_138,
             &local_228,opt);
  iVar11 = local_228.w;
  iVar19 = local_228.elempack;
  iVar18 = -100;
  if ((local_228.data == (void *)0x0) || (local_228.cstep * (long)local_228.c == 0))
  goto LAB_0028c887;
  p_Var14 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar16 = (~((iVar16 + -1) * iVar21) + local_228.w) / *(int *)(&this->field_0xe4 + (long)p_Var14);
  iVar21 = iVar16 + 1;
  uVar34 = (long)(~((iVar28 + -1) * iVar33) + local_228.h) /
           (long)*(int *)(&this->field_0xe8 + (long)p_Var14);
  local_238 = uVar34 & 0xffffffff;
  iVar28 = (int)uVar34 + 1;
  uVar20 = local_228.elempack * local_228.c;
  if ((uVar20 == *(uint *)(&this->field_0x108 + (long)p_Var14)) &&
     (uVar20 - *(int *)(&this->field_0xd0 + (long)p_Var14) == 0)) {
    uVar13 = 8;
    if (opt->use_packing_layout == false) {
      uVar13 = 1;
    }
    if ((uVar20 & 7) != 0) {
      uVar13 = 1;
    }
    opt_00 = (Option *)(ulong)uVar13;
    iVar33 = *(int *)(&this->field_0x10c + (long)p_Var14);
    _elemsize = (Option *)(ulong)(uVar13 * 4);
    if (100 < iVar33) {
      _elemsize = opt_00;
    }
    local_2a0 = (void *)(long)local_228.c;
    Mat::create(top_blob,iVar21,iVar28,(int)uVar20 / (int)uVar13,(size_t)_elemsize,uVar13,
                opt->blob_allocator);
    iVar18 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_0028c887;
    iVar18 = 0;
    if (iVar19 == 1) {
      pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx;
      p_Var14 = pp_Var15[-3];
      iVar28 = *(int *)(&this->field_0xd8 + (long)p_Var14);
      if (iVar28 == 3 && *(int *)(&this->field_0xd4 + (long)p_Var14) == 3) {
        if ((((*(int *)(&this->field_0xe4 + (long)p_Var14) == 1) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var14) == 1)) &&
            (*(int *)(&this->field_0xdc + (long)p_Var14) == 1)) &&
           ((*(int *)(&this->field_0xe0 + (long)p_Var14) == 1 &&
            (*(uint *)(&this->field_0x110 + (long)p_Var14) < 2)))) {
          if (iVar33 < 0x65) {
            local_2f8._0_16_ = (undefined1  [16])0x0;
            local_2f8._16_8_ = (Allocator *)0x0;
            p_Var14 = (_func_int *)
                      ((long)&this->_vptr_ConvolutionDepthWise_x86_avx + (long)pp_Var15[-3]);
            if (0 < *(int *)(&this->field_0x108 + (long)pp_Var15[-3])) {
              lVar27 = 0;
              do {
                fVar22 = 1.0 / (*(float *)(*(long *)(p_Var14 + 0x1f8) + lVar27 * 4) *
                               *(float *)(*(long *)(p_Var14 + 0x240) + lVar27 * 4));
                local_288.data = (void *)CONCAT44(local_288.data._4_4_,fVar22);
                if (local_2f8._8_8_ == local_2f8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2f8,
                             (iterator)local_2f8._8_8_,(float *)&local_288);
                  pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx;
                }
                else {
                  *(float *)local_2f8._8_8_ = fVar22;
                  local_2f8._8_8_ = (float *)(local_2f8._8_8_ + 4);
                }
                lVar27 = lVar27 + 1;
                p_Var14 = (_func_int *)
                          ((long)&this->_vptr_ConvolutionDepthWise_x86_avx + (long)pp_Var15[-3]);
              } while (lVar27 < *(int *)(&this->field_0x108 + (long)pp_Var15[-3]));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)local_2f8);
            convdw3x3s1_int8_dequant_sse
                      (&local_228,top_blob,*(Mat **)(p_Var14 + 0x168),*(Mat **)(p_Var14 + 0x1b0),
                       &local_a8,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          else {
            local_2f8._0_16_ = (undefined1  [16])0x0;
            local_2f8._16_8_ = (Allocator *)0x0;
            p_Var14 = (_func_int *)
                      ((long)&this->_vptr_ConvolutionDepthWise_x86_avx + (long)pp_Var15[-3]);
            if (0 < *(int *)(&this->field_0x108 + (long)pp_Var15[-3])) {
              lVar27 = 0;
              do {
                fVar22 = *(float *)(*(long *)(p_Var14 + 0x1f8) + lVar27 * 4);
                fVar36 = 0.0;
                if (fVar22 != 0.0) {
                  fVar36 = 1.0 / (fVar22 * *(float *)(*(long *)(p_Var14 + 0x240) + lVar27 * 4));
                }
                local_288.data = (void *)CONCAT44(local_288.data._4_4_,fVar36);
                local_1d0 = (pointer)CONCAT44(local_1d0._4_4_,
                                              *(undefined4 *)
                                               (*(long *)(p_Var14 + 0x288) + lVar27 * 4));
                if (local_2f8._8_8_ == local_2f8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2f8,
                             (iterator)local_2f8._8_8_,(float *)&local_288);
                  iVar23._M_current = (float *)local_2f8._8_8_;
                }
                else {
                  *(float *)local_2f8._8_8_ = fVar36;
                  iVar23._M_current = (float *)(local_2f8._8_8_ + 4);
                  local_2f8._8_8_ = iVar23._M_current;
                }
                if (iVar23._M_current == (float *)local_2f8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2f8,iVar23,
                             (float *)&local_1d0);
                }
                else {
                  *iVar23._M_current = local_1d0._0_4_;
                  local_2f8._8_8_ = iVar23._M_current + 1;
                }
                lVar27 = lVar27 + 1;
                p_Var14 = (_func_int *)
                          ((long)&this->_vptr_ConvolutionDepthWise_x86_avx +
                          (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
              } while (lVar27 < *(int *)(&this->field_0x108 +
                                        (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)local_2f8);
            convdw3x3s1_int8_requant_sse
                      (&local_228,top_blob,*(Mat **)(p_Var14 + 0x168),*(Mat **)(p_Var14 + 0x1b0),
                       &local_90,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
        }
        else {
          iVar28 = 3;
          if ((((*(int *)(&this->field_0xdc + (long)p_Var14) != 1) ||
               ((*(int *)(&this->field_0xe0 + (long)p_Var14) != 1 ||
                (*(int *)(&this->field_0xe4 + (long)p_Var14) != 2)))) ||
              (*(int *)(&this->field_0xe8 + (long)p_Var14) != 2)) ||
             (1 < *(uint *)(&this->field_0x110 + (long)p_Var14))) goto LAB_0028c2f3;
          if (iVar33 < 0x65) {
            local_2f8._0_16_ = (undefined1  [16])0x0;
            local_2f8._16_8_ = (Allocator *)0x0;
            p_Var14 = (_func_int *)
                      ((long)&this->_vptr_ConvolutionDepthWise_x86_avx + (long)pp_Var15[-3]);
            if (0 < *(int *)(&this->field_0x108 + (long)pp_Var15[-3])) {
              lVar27 = 0;
              do {
                fVar22 = 1.0 / (*(float *)(*(long *)(p_Var14 + 0x1f8) + lVar27 * 4) *
                               *(float *)(*(long *)(p_Var14 + 0x240) + lVar27 * 4));
                local_288.data = (void *)CONCAT44(local_288.data._4_4_,fVar22);
                if (local_2f8._8_8_ == local_2f8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2f8,
                             (iterator)local_2f8._8_8_,(float *)&local_288);
                  pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx;
                }
                else {
                  *(float *)local_2f8._8_8_ = fVar22;
                  local_2f8._8_8_ = (float *)(local_2f8._8_8_ + 4);
                }
                lVar27 = lVar27 + 1;
                p_Var14 = (_func_int *)
                          ((long)&this->_vptr_ConvolutionDepthWise_x86_avx + (long)pp_Var15[-3]);
              } while (lVar27 < *(int *)(&this->field_0x108 + (long)pp_Var15[-3]));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_d8,(vector<float,_std::allocator<float>_> *)local_2f8);
            convdw3x3s2_int8_dequant_sse
                      (&local_228,top_blob,*(Mat **)(p_Var14 + 0x168),*(Mat **)(p_Var14 + 0x1b0),
                       &local_d8,opt_00);
          }
          else {
            local_2f8._0_16_ = (undefined1  [16])0x0;
            local_2f8._16_8_ = (Allocator *)0x0;
            p_Var14 = (_func_int *)
                      ((long)&this->_vptr_ConvolutionDepthWise_x86_avx + (long)pp_Var15[-3]);
            if (0 < *(int *)(&this->field_0x108 + (long)pp_Var15[-3])) {
              lVar27 = 0;
              do {
                fVar22 = *(float *)(*(long *)(p_Var14 + 0x1f8) + lVar27 * 4);
                fVar36 = 0.0;
                if (fVar22 != 0.0) {
                  fVar36 = 1.0 / (fVar22 * *(float *)(*(long *)(p_Var14 + 0x240) + lVar27 * 4));
                }
                local_288.data = (void *)CONCAT44(local_288.data._4_4_,fVar36);
                local_1d0 = (pointer)CONCAT44(local_1d0._4_4_,
                                              *(undefined4 *)
                                               (*(long *)(p_Var14 + 0x288) + lVar27 * 4));
                if (local_2f8._8_8_ == local_2f8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2f8,
                             (iterator)local_2f8._8_8_,(float *)&local_288);
                  iVar23._M_current = (float *)local_2f8._8_8_;
                }
                else {
                  *(float *)local_2f8._8_8_ = fVar36;
                  iVar23._M_current = (float *)(local_2f8._8_8_ + 4);
                  local_2f8._8_8_ = iVar23._M_current;
                }
                if (iVar23._M_current == (float *)local_2f8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2f8,iVar23,
                             (float *)&local_1d0);
                }
                else {
                  *iVar23._M_current = local_1d0._0_4_;
                  local_2f8._8_8_ = iVar23._M_current + 1;
                }
                lVar27 = lVar27 + 1;
                p_Var14 = (_func_int *)
                          ((long)&this->_vptr_ConvolutionDepthWise_x86_avx +
                          (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
              } while (lVar27 < *(int *)(&this->field_0x108 +
                                        (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_c0,(vector<float,_std::allocator<float>_> *)local_2f8);
            convdw3x3s2_int8_requant_sse
                      (&local_228,top_blob,*(Mat **)(p_Var14 + 0x168),*(Mat **)(p_Var14 + 0x1b0),
                       &local_c0,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
        }
        if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ - local_2f8._0_8_);
        }
        pLVar4 = this->activation;
        if (pLVar4 != (Layer *)0x0) {
          (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
          iVar18 = 0;
          goto LAB_0028c887;
        }
      }
      else {
LAB_0028c2f3:
        iVar28 = iVar28 * *(int *)(&this->field_0xd4 + (long)p_Var14);
        local_2a0 = (void *)CONCAT44(local_2a0._4_4_,iVar28);
        local_140 = (size_type)iVar28;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_2f8,local_140,
                   (allocator_type *)&local_288);
        uVar9 = local_2f8._0_8_;
        pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx;
        p_Var14 = pp_Var15[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var14)) {
          iVar28 = *(int *)(&this->field_0xe0 + (long)p_Var14);
          iVar21 = *(int *)(&this->field_0xdc + (long)p_Var14);
          iVar19 = *(int *)(&this->field_0xd4 + (long)p_Var14);
          iVar18 = 0;
          fVar22 = 0.0;
          iVar25 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var14)) {
              lVar27 = 0;
              do {
                *(float *)(local_2f8._0_8_ + (iVar25 + lVar27) * 4) = fVar22;
                p_Var14 = pp_Var15[-3];
                fVar22 = (float)((int)fVar22 + *(int *)(&this->field_0xdc + (long)p_Var14));
                lVar27 = lVar27 + 1;
              } while ((int)lVar27 < *(int *)(&this->field_0xd4 + (long)p_Var14));
              iVar25 = iVar25 + (int)lVar27;
            }
            fVar22 = (float)((int)fVar22 + (iVar11 * iVar28 - iVar21 * iVar19));
            iVar18 = iVar18 + 1;
          } while (iVar18 < *(int *)(&this->field_0xd8 + (long)p_Var14));
        }
        if (0 < *(int *)(&this->field_0x108 + (long)p_Var14)) {
          uVar34 = (ulong)local_2a0 & 0xffffffff;
          local_1e0 = 0;
          auVar45 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          lVar27 = 0;
          iVar28 = (int)local_2a0;
          local_230 = pp_Var15;
          do {
            if (-1 < (int)local_238) {
              pvVar30 = (void *)(local_228.cstep * lVar27 * local_228.elemsize +
                                (long)local_228.data);
              local_300 = (float *)(top_blob->cstep * lVar27 * top_blob->elemsize +
                                   (long)top_blob->data);
              local_2b0 = (long)local_228.w * local_228.elemsize;
              lVar32 = *(long *)(&this->field_0x168 + (long)p_Var14) + local_1e0;
              local_1d8 = 0;
              local_2a8 = local_300;
              local_298 = pvVar30;
              do {
                if (-1 < iVar16) {
                  local_290 = (ulong)(int)local_1d8;
                  iVar21 = 0;
                  do {
                    p_Var14 = pp_Var15[-3];
                    fVar22 = 0.0;
                    fVar36 = 0.0;
                    if (0 < iVar28) {
                      uVar31 = 0;
                      iVar19 = 0;
                      do {
                        iVar19 = iVar19 + (int)*(char *)(lVar32 + uVar31) *
                                          (int)*(char *)((long)pvVar30 +
                                                        (long)(int)*(pointer)(uVar9 + uVar31 * 4) +
                                                        (long)*(int *)(&this->field_0xe8 +
                                                                      (long)p_Var14) * local_290 *
                                                        local_2b0 +
                                                        (long)iVar21 *
                                                        (long)*(int *)(&this->field_0xe4 +
                                                                      (long)p_Var14));
                        uVar31 = uVar31 + 1;
                      } while (uVar34 != uVar31);
                      fVar36 = (float)iVar19;
                    }
                    fVar86 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var14) + lVar27 * 4);
                    if (fVar86 != 0.0) {
                      fVar22 = 1.0 / (fVar86 * *(float *)(*(long *)(&this->field_0x240 +
                                                                   (long)p_Var14) + lVar27 * 4));
                    }
                    fVar22 = fVar22 * fVar36;
                    if (*(int *)(&this->field_0x100 + (long)p_Var14) != 0) {
                      fVar22 = fVar22 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var14) +
                                                  lVar27 * 4);
                    }
                    auVar37 = ZEXT416((uint)fVar22);
                    fVar36 = fVar22;
                    switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var14)) {
                    case 1:
                      auVar37 = vmaxss_avx(auVar37,ZEXT416(0));
                      fVar36 = auVar37._0_4_;
                      break;
                    case 2:
                      auVar37 = vcmpss_avx(ZEXT816(0) << 0x40,auVar37,1);
                      auVar95._8_4_ = 0x3f800000;
                      auVar95._0_8_ = 0x3f8000003f800000;
                      auVar95._12_4_ = 0x3f800000;
                      auVar37 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var14
                                                                 )),auVar95,auVar37);
                      fVar88 = auVar37._0_4_;
LAB_0028c647:
                      fVar36 = fVar88 * fVar22;
                      break;
                    case 3:
                      auVar37 = vmaxss_avx(auVar37,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                      (long)p_Var14)));
                      auVar37 = vminss_avx(auVar37,ZEXT416((*(uint **)(&this->field_0x118 +
                                                                      (long)p_Var14))[1]));
                      fVar36 = auVar37._0_4_;
                      break;
                    case 4:
                      fVar22 = expf((float)((uint)fVar22 ^ auVar45._0_4_));
                      auVar45 = ZEXT1664(CONCAT412(0x80000000,
                                                   CONCAT48(0x80000000,0x8000000080000000)));
                      pp_Var15 = local_230;
                      pvVar30 = local_298;
                      iVar28 = (int)local_2a0;
                      fVar36 = 1.0 / (fVar22 + 1.0);
                      break;
                    case 5:
                      local_e8 = auVar37;
                      fVar22 = expf(fVar22);
                      fVar22 = logf(fVar22 + 1.0);
                      fVar22 = tanhf(fVar22);
                      auVar45 = ZEXT1664(CONCAT412(0x80000000,
                                                   CONCAT48(0x80000000,0x8000000080000000)));
                      pp_Var15 = local_230;
                      pvVar30 = local_298;
                      iVar28 = (int)local_2a0;
                      fVar36 = fVar22 * (float)local_e8._0_4_;
                      break;
                    case 6:
                      fVar86 = **(float **)(&this->field_0x118 + (long)p_Var14);
                      fVar88 = (*(float **)(&this->field_0x118 + (long)p_Var14))[1];
                      fVar56 = (float)((uint)fVar88 ^ auVar45._0_4_) / fVar86;
                      fVar36 = 0.0;
                      if ((fVar56 <= fVar22) && (fVar36 = fVar22, fVar22 <= fVar56 + 1.0 / fVar86))
                      {
                        fVar88 = fVar86 * fVar22 + fVar88;
                        goto LAB_0028c647;
                      }
                    }
                    if (iVar33 < 0x65) {
                      *local_2a8 = fVar36;
                      local_2a8 = local_2a8 + 1;
                    }
                    else {
                      fVar36 = fVar36 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var14) +
                                                  lVar27 * 4);
                      auVar37 = vandps_avx(ZEXT416((uint)fVar36),auVar45._0_16_);
                      auVar101._8_4_ = 0x3effffff;
                      auVar101._0_8_ = 0x3effffff3effffff;
                      auVar101._12_4_ = 0x3effffff;
                      auVar37 = vorps_avx(auVar37,auVar101);
                      auVar37 = ZEXT416((uint)(fVar36 + auVar37._0_4_));
                      auVar37 = vroundss_avx(auVar37,auVar37,0xb);
                      iVar19 = (int)auVar37._0_4_;
                      if (iVar19 < -0x7e) {
                        iVar19 = -0x7f;
                      }
                      uVar12 = (undefined1)iVar19;
                      if (0x7e < iVar19) {
                        uVar12 = 0x7f;
                      }
                      *(undefined1 *)local_300 = uVar12;
                      local_300 = (float *)((long)local_300 + 1);
                    }
                    bVar35 = iVar21 != iVar16;
                    iVar21 = iVar21 + 1;
                  } while (bVar35);
                }
                iVar21 = (int)local_1d8;
                local_1d8 = (ulong)(iVar21 + 1);
              } while (iVar21 != (int)local_238);
            }
            p_Var14 = pp_Var15[-3];
            lVar27 = lVar27 + 1;
            local_1e0 = local_1e0 + local_140;
          } while (lVar27 < *(int *)(&this->field_0x108 + (long)p_Var14));
        }
        if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
          uVar34 = local_2f8._16_8_ - local_2f8._0_8_;
          pfVar24 = (pointer)local_2f8._0_8_;
          goto LAB_0028c796;
        }
      }
    }
    else {
      if (iVar19 != 8) goto LAB_0028c887;
      uVar34 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ) *
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             );
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_2f8,uVar34,(allocator_type *)&local_288)
      ;
      pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx;
      p_Var14 = pp_Var15[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var14)) {
        iVar28 = *(int *)(&this->field_0xe0 + (long)p_Var14);
        iVar21 = *(int *)(&this->field_0xdc + (long)p_Var14);
        iVar19 = *(int *)(&this->field_0xd4 + (long)p_Var14);
        iVar18 = 0;
        fVar22 = 0.0;
        iVar25 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var14)) {
            lVar27 = 0;
            do {
              *(float *)(local_2f8._0_8_ + (iVar18 + lVar27) * 4) = fVar22;
              p_Var14 = pp_Var15[-3];
              fVar22 = (float)((int)fVar22 + *(int *)(&this->field_0xdc + (long)p_Var14));
              lVar27 = lVar27 + 1;
            } while ((int)lVar27 < *(int *)(&this->field_0xd4 + (long)p_Var14));
            iVar18 = iVar18 + (int)lVar27;
          }
          fVar22 = (float)((int)fVar22 + (iVar11 * iVar28 - iVar21 * iVar19));
          iVar25 = iVar25 + 1;
        } while (iVar25 < *(int *)(&this->field_0xd8 + (long)p_Var14));
      }
      if (0 < (int)local_2a0) {
        iVar28 = (int)uVar34 * 8;
        local_230 = (_func_int **)CONCAT44(local_230._4_4_,iVar28);
        local_2b0 = 0;
        auVar45 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar120 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        local_298 = (void *)0x0;
        do {
          if (-1 < (int)local_238) {
            local_2a8 = (float *)(local_228.cstep * (long)local_298 * local_228.elemsize +
                                 (long)local_228.data);
            pauVar26 = (undefined1 (*) [16])
                       (top_blob->cstep * (long)local_298 * top_blob->elemsize +
                       (long)top_blob->data);
            pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx;
            pvVar30 = (this->weight_data_int8).data;
            uVar31 = 0;
            pauVar29 = pauVar26;
            do {
              local_290 = uVar31;
              iVar21 = (int)local_290;
              if (-1 < iVar16) {
                iVar19 = 0;
                do {
                  p_Var14 = pp_Var15[-3];
                  if ((int)uVar34 < 1) {
                    auVar95 = ZEXT816(0) << 0x40;
                    auVar37 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar63 = ZEXT1664((undefined1  [16])0x0);
                    uVar31 = 0;
                    auVar70 = ZEXT1664((undefined1  [16])0x0);
                    do {
                      auVar96._8_8_ = 0;
                      auVar96._0_8_ =
                           *(ulong *)((long)local_2a8 +
                                     (long)(int)*(pointer)(local_2f8._0_8_ + uVar31 * 4) * 8 +
                                     (long)*(int *)(&this->field_0xe8 + (long)p_Var14) *
                                     (long)iVar21 * (long)local_228.w * local_228.elemsize +
                                     (long)(*(int *)(&this->field_0xe4 + (long)p_Var14) * iVar19 * 8
                                           ));
                      auVar37 = vpcmpgtb_avx((undefined1  [16])0x0,auVar96);
                      auVar95 = vpunpcklbw_avx(auVar96,auVar37);
                      auVar91._8_8_ = 0;
                      auVar91._0_8_ = *(ulong *)((long)pvVar30 + uVar31 * 8 + (long)(int)local_2b0);
                      auVar37 = vpcmpgtb_avx((undefined1  [16])0x0,auVar91);
                      auVar37 = vpunpcklbw_avx(auVar91,auVar37);
                      auVar101 = vpmullw_avx(auVar37,auVar95);
                      auVar95 = vpmulhw_avx(auVar95,auVar37);
                      auVar37 = vpunpcklwd_avx(auVar101,auVar95);
                      auVar37 = vpaddd_avx(auVar63._0_16_,auVar37);
                      auVar63 = ZEXT1664(auVar37);
                      auVar95 = vpunpckhwd_avx(auVar101,auVar95);
                      auVar95 = vpaddd_avx(auVar70._0_16_,auVar95);
                      auVar70 = ZEXT1664(auVar95);
                      uVar31 = uVar31 + 1;
                    } while ((uVar34 & 0xffffffff) != uVar31);
                    auVar37 = vcvtdq2ps_avx(auVar37);
                    auVar95 = vcvtdq2ps_avx(auVar95);
                  }
                  auVar101 = *(undefined1 (*) [16])
                              (*(long *)(&this->field_0x1f8 + (long)p_Var14) +
                              (long)local_298 * 0x20);
                  auVar96 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0x1f8 + (long)p_Var14) + 0x10 +
                             (long)local_298 * 0x20);
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var14) +
                                    (long)local_298 * 0x20);
                  auVar92._0_4_ = auVar101._0_4_ * *pfVar1;
                  auVar92._4_4_ = auVar101._4_4_ * pfVar1[1];
                  auVar92._8_4_ = auVar101._8_4_ * pfVar1[2];
                  auVar92._12_4_ = auVar101._12_4_ * pfVar1[3];
                  auVar91 = vrcpps_avx(auVar92);
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var14) + 0x10 +
                                    (long)local_298 * 0x20);
                  auVar109._0_4_ = auVar96._0_4_ * *pfVar1;
                  auVar109._4_4_ = auVar96._4_4_ * pfVar1[1];
                  auVar109._8_4_ = auVar96._8_4_ * pfVar1[2];
                  auVar109._12_4_ = auVar96._12_4_ * pfVar1[3];
                  auVar64 = vrcpps_avx(auVar109);
                  auVar101 = vcmpps_avx(auVar101,(undefined1  [16])0x0,4);
                  auVar101 = vandps_avx(auVar101,auVar91);
                  auVar57._0_4_ = auVar101._0_4_ * auVar37._0_4_;
                  auVar57._4_4_ = auVar101._4_4_ * auVar37._4_4_;
                  auVar57._8_4_ = auVar101._8_4_ * auVar37._8_4_;
                  auVar57._12_4_ = auVar101._12_4_ * auVar37._12_4_;
                  auVar37 = vcmpps_avx(auVar96,(undefined1  [16])0x0,4);
                  auVar37 = vandps_avx(auVar37,auVar64);
                  auVar64._0_4_ = auVar37._0_4_ * auVar95._0_4_;
                  auVar64._4_4_ = auVar37._4_4_ * auVar95._4_4_;
                  auVar64._8_4_ = auVar37._8_4_ * auVar95._8_4_;
                  auVar64._12_4_ = auVar37._12_4_ * auVar95._12_4_;
                  if (*(int *)(&this->field_0x100 + (long)p_Var14) != 0) {
                    pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var14) +
                                      (long)local_298 * 0x20);
                    auVar57._0_4_ = auVar57._0_4_ + *pfVar1;
                    auVar57._4_4_ = auVar57._4_4_ + pfVar1[1];
                    auVar57._8_4_ = auVar57._8_4_ + pfVar1[2];
                    auVar57._12_4_ = auVar57._12_4_ + pfVar1[3];
                    pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var14) + 0x10 +
                                      (long)local_298 * 0x20);
                    auVar64._0_4_ = auVar64._0_4_ + *pfVar1;
                    auVar64._4_4_ = auVar64._4_4_ + pfVar1[1];
                    auVar64._8_4_ = auVar64._8_4_ + pfVar1[2];
                    auVar64._12_4_ = auVar64._12_4_ + pfVar1[3];
                  }
                  auVar37 = auVar120._0_16_;
                  fVar22 = auVar57._0_4_;
                  fVar86 = auVar57._4_4_;
                  fVar88 = auVar57._8_4_;
                  fVar90 = auVar57._12_4_;
                  fVar36 = auVar64._4_4_;
                  fVar56 = auVar64._8_4_;
                  fVar5 = auVar64._12_4_;
                  fVar119 = auVar120._0_4_;
                  fVar121 = auVar120._4_4_;
                  fVar122 = auVar120._8_4_;
                  fVar123 = auVar120._12_4_;
                  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var14)) {
                  case 1:
                    auVar57 = vmaxps_avx(auVar57,(undefined1  [16])0x0);
                    auVar64 = vmaxps_avx(auVar64,(undefined1  [16])0x0);
                    break;
                  case 2:
                    auVar37 = vmaxps_avx(auVar57,(undefined1  [16])0x0);
                    auVar95 = vminps_avx(auVar57,(undefined1  [16])0x0);
                    fVar22 = **(float **)(&this->field_0x118 + (long)p_Var14);
                    auVar57._0_4_ = fVar22 * auVar95._0_4_ + auVar37._0_4_;
                    auVar57._4_4_ = fVar22 * auVar95._4_4_ + auVar37._4_4_;
                    auVar57._8_4_ = fVar22 * auVar95._8_4_ + auVar37._8_4_;
                    auVar57._12_4_ = fVar22 * auVar95._12_4_ + auVar37._12_4_;
                    auVar37 = vmaxps_avx(auVar64,(undefined1  [16])0x0);
                    auVar95 = vminps_avx(auVar64,(undefined1  [16])0x0);
                    auVar64._0_4_ = fVar22 * auVar95._0_4_ + auVar37._0_4_;
                    auVar64._4_4_ = fVar22 * auVar95._4_4_ + auVar37._4_4_;
                    auVar64._8_4_ = fVar22 * auVar95._8_4_ + auVar37._8_4_;
                    auVar64._12_4_ = fVar22 * auVar95._12_4_ + auVar37._12_4_;
                    break;
                  case 3:
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var14);
                    auVar79._4_4_ = uVar2;
                    auVar79._0_4_ = uVar2;
                    auVar79._8_4_ = uVar2;
                    auVar79._12_4_ = uVar2;
                    uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var14))[1];
                    auVar104._4_4_ = uVar2;
                    auVar104._0_4_ = uVar2;
                    auVar104._8_4_ = uVar2;
                    auVar104._12_4_ = uVar2;
                    auVar37 = vmaxps_avx(auVar57,auVar79);
                    auVar57 = vminps_avx(auVar37,auVar104);
                    auVar37 = vmaxps_avx(auVar64,auVar79);
                    auVar64 = vminps_avx(auVar37,auVar104);
                    break;
                  case 4:
                    auVar58._0_8_ = auVar57._0_8_ ^ 0x8000000080000000;
                    auVar58._8_4_ = -fVar88;
                    auVar58._12_4_ = -fVar90;
                    auVar124._8_4_ = 0x42b0c0a5;
                    auVar124._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar124._12_4_ = 0x42b0c0a5;
                    auVar95 = vminps_avx(auVar124,auVar58);
                    auVar127._8_4_ = 0xc2b0c0a5;
                    auVar127._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar127._12_4_ = 0xc2b0c0a5;
                    auVar96 = vmaxps_avx(auVar127,auVar95);
                    auVar80._0_4_ = auVar96._0_4_ * 1.442695 + auVar45._0_4_;
                    auVar80._4_4_ = auVar96._4_4_ * 1.442695 + auVar45._4_4_;
                    auVar80._8_4_ = auVar96._8_4_ * 1.442695 + auVar45._8_4_;
                    auVar80._12_4_ = auVar96._12_4_ * 1.442695 + auVar45._12_4_;
                    auVar105._0_4_ = (int)auVar80._0_4_;
                    auVar105._4_4_ = (int)auVar80._4_4_;
                    auVar105._8_4_ = (int)auVar80._8_4_;
                    auVar105._12_4_ = (int)auVar80._12_4_;
                    auVar101 = vcvtdq2ps_avx(auVar105);
                    auVar95 = vcmpps_avx(auVar80,auVar101,1);
                    auVar95 = vandps_avx(auVar37,auVar95);
                    auVar95 = vsubps_avx(auVar101,auVar95);
                    auVar106._0_4_ = auVar95._0_4_ * 0.6931472;
                    auVar106._4_4_ = auVar95._4_4_ * 0.6931472;
                    auVar106._8_4_ = auVar95._8_4_ * 0.6931472;
                    auVar106._12_4_ = auVar95._12_4_ * 0.6931472;
                    auVar101 = vsubps_avx(auVar96,auVar106);
                    fVar22 = auVar101._0_4_;
                    fVar36 = auVar101._4_4_;
                    fVar86 = auVar101._8_4_;
                    fVar88 = auVar101._12_4_;
                    auVar120 = ZEXT1664(auVar37);
                    auVar81._0_4_ = (int)auVar95._0_4_;
                    auVar81._4_4_ = (int)auVar95._4_4_;
                    auVar81._8_4_ = (int)auVar95._8_4_;
                    auVar81._12_4_ = (int)auVar95._12_4_;
                    auVar95 = vpslld_avx(auVar81,0x17);
                    auVar95 = vpaddd_avx(auVar37,auVar95);
                    auVar59._0_4_ =
                         fVar119 + (fVar119 + fVar22 +
                                   fVar22 * fVar22 *
                                   (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 +
                                      0.008333452) * fVar22 + 0.041665796) * fVar22 + 0.16666666) *
                                    fVar22 + 0.5)) * auVar95._0_4_;
                    auVar59._4_4_ =
                         fVar121 + (fVar121 + fVar36 +
                                   fVar36 * fVar36 *
                                   (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 +
                                      0.008333452) * fVar36 + 0.041665796) * fVar36 + 0.16666666) *
                                    fVar36 + 0.5)) * auVar95._4_4_;
                    auVar59._8_4_ =
                         fVar122 + (fVar122 + fVar86 +
                                   fVar86 * fVar86 *
                                   (((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 +
                                      0.008333452) * fVar86 + 0.041665796) * fVar86 + 0.16666666) *
                                    fVar86 + 0.5)) * auVar95._8_4_;
                    auVar59._12_4_ =
                         fVar123 + (fVar123 + fVar88 +
                                   fVar88 * fVar88 *
                                   (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 +
                                      0.008333452) * fVar88 + 0.041665796) * fVar88 + 0.16666666) *
                                    fVar88 + 0.5)) * auVar95._12_4_;
                    auVar95 = vrcpps_avx(auVar59);
                    fVar22 = auVar95._0_4_;
                    auVar60._0_4_ = auVar59._0_4_ * fVar22;
                    fVar36 = auVar95._4_4_;
                    auVar60._4_4_ = auVar59._4_4_ * fVar36;
                    fVar86 = auVar95._8_4_;
                    auVar60._8_4_ = auVar59._8_4_ * fVar86;
                    fVar88 = auVar95._12_4_;
                    auVar60._12_4_ = auVar59._12_4_ * fVar88;
                    auVar95 = vsubps_avx(auVar37,auVar60);
                    auVar57._0_4_ = fVar22 + fVar22 * auVar95._0_4_;
                    auVar57._4_4_ = fVar36 + fVar36 * auVar95._4_4_;
                    auVar57._8_4_ = fVar86 + fVar86 * auVar95._8_4_;
                    auVar57._12_4_ = fVar88 + fVar88 * auVar95._12_4_;
                    auVar65._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
                    auVar65._8_4_ = -fVar56;
                    auVar65._12_4_ = -fVar5;
                    auVar95 = vminps_avx(auVar124,auVar65);
                    auVar96 = vmaxps_avx(auVar127,auVar95);
                    auVar82._0_4_ = auVar96._0_4_ * 1.442695 + 0.5;
                    auVar82._4_4_ = auVar96._4_4_ * 1.442695 + 0.5;
                    auVar82._8_4_ = auVar96._8_4_ * 1.442695 + 0.5;
                    auVar82._12_4_ = auVar96._12_4_ * 1.442695 + 0.5;
                    auVar107._0_4_ = (int)auVar82._0_4_;
                    auVar107._4_4_ = (int)auVar82._4_4_;
                    auVar107._8_4_ = (int)auVar82._8_4_;
                    auVar107._12_4_ = (int)auVar82._12_4_;
                    auVar101 = vcvtdq2ps_avx(auVar107);
                    auVar95 = vcmpps_avx(auVar82,auVar101,1);
                    auVar95 = vandps_avx(auVar37,auVar95);
                    auVar95 = vsubps_avx(auVar101,auVar95);
                    auVar108._0_4_ = auVar95._0_4_ * 0.6931472;
                    auVar108._4_4_ = auVar95._4_4_ * 0.6931472;
                    auVar108._8_4_ = auVar95._8_4_ * 0.6931472;
                    auVar108._12_4_ = auVar95._12_4_ * 0.6931472;
                    auVar45 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000))
                                      );
                    auVar101 = vsubps_avx(auVar96,auVar108);
                    fVar22 = auVar101._0_4_;
                    fVar36 = auVar101._4_4_;
                    fVar86 = auVar101._8_4_;
                    fVar88 = auVar101._12_4_;
                    auVar83._0_4_ = (int)auVar95._0_4_;
                    auVar83._4_4_ = (int)auVar95._4_4_;
                    auVar83._8_4_ = (int)auVar95._8_4_;
                    auVar83._12_4_ = (int)auVar95._12_4_;
                    auVar95 = vpslld_avx(auVar83,0x17);
                    auVar95 = vpaddd_avx(auVar37,auVar95);
                    auVar66._0_4_ =
                         fVar119 + (fVar119 + fVar22 +
                                   fVar22 * fVar22 *
                                   (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 +
                                      0.008333452) * fVar22 + 0.041665796) * fVar22 + 0.16666666) *
                                    fVar22 + 0.5)) * auVar95._0_4_;
                    auVar66._4_4_ =
                         fVar121 + (fVar121 + fVar36 +
                                   fVar36 * fVar36 *
                                   (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 +
                                      0.008333452) * fVar36 + 0.041665796) * fVar36 + 0.16666666) *
                                    fVar36 + 0.5)) * auVar95._4_4_;
                    auVar66._8_4_ =
                         fVar122 + (fVar122 + fVar86 +
                                   fVar86 * fVar86 *
                                   (((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 +
                                      0.008333452) * fVar86 + 0.041665796) * fVar86 + 0.16666666) *
                                    fVar86 + 0.5)) * auVar95._8_4_;
                    auVar66._12_4_ =
                         fVar123 + (fVar123 + fVar88 +
                                   fVar88 * fVar88 *
                                   (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 +
                                      0.008333452) * fVar88 + 0.041665796) * fVar88 + 0.16666666) *
                                    fVar88 + 0.5)) * auVar95._12_4_;
                    auVar95 = vrcpps_avx(auVar66);
                    fVar22 = auVar95._0_4_;
                    auVar67._0_4_ = auVar66._0_4_ * fVar22;
                    fVar36 = auVar95._4_4_;
                    auVar67._4_4_ = auVar66._4_4_ * fVar36;
                    fVar86 = auVar95._8_4_;
                    auVar67._8_4_ = auVar66._8_4_ * fVar86;
                    fVar88 = auVar95._12_4_;
                    auVar67._12_4_ = auVar66._12_4_ * fVar88;
                    auVar37 = vsubps_avx(auVar37,auVar67);
                    auVar64._0_4_ = fVar22 + fVar22 * auVar37._0_4_;
                    auVar64._4_4_ = fVar36 + fVar36 * auVar37._4_4_;
                    auVar64._8_4_ = fVar86 + fVar86 * auVar37._8_4_;
                    auVar64._12_4_ = fVar88 + fVar88 * auVar37._12_4_;
                    break;
                  case 5:
                    auVar125._8_4_ = 0x42b0c0a5;
                    auVar125._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar125._12_4_ = 0x42b0c0a5;
                    auVar95 = vminps_avx(auVar125,auVar57);
                    auVar128._8_4_ = 0xc2b0c0a5;
                    auVar128._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar128._12_4_ = 0xc2b0c0a5;
                    auVar96 = vmaxps_avx(auVar128,auVar95);
                    auVar93._0_4_ = auVar96._0_4_ * 1.442695 + auVar45._0_4_;
                    auVar93._4_4_ = auVar96._4_4_ * 1.442695 + auVar45._4_4_;
                    auVar93._8_4_ = auVar96._8_4_ * 1.442695 + auVar45._8_4_;
                    auVar93._12_4_ = auVar96._12_4_ * 1.442695 + auVar45._12_4_;
                    auVar110._0_4_ = (int)auVar93._0_4_;
                    auVar110._4_4_ = (int)auVar93._4_4_;
                    auVar110._8_4_ = (int)auVar93._8_4_;
                    auVar110._12_4_ = (int)auVar93._12_4_;
                    auVar101 = vcvtdq2ps_avx(auVar110);
                    auVar95 = vcmpps_avx(auVar93,auVar101,1);
                    auVar95 = vandps_avx(auVar37,auVar95);
                    auVar95 = vsubps_avx(auVar101,auVar95);
                    auVar111._0_4_ = auVar95._0_4_ * 0.6931472;
                    auVar111._4_4_ = auVar95._4_4_ * 0.6931472;
                    auVar111._8_4_ = auVar95._8_4_ * 0.6931472;
                    auVar111._12_4_ = auVar95._12_4_ * 0.6931472;
                    auVar101 = vsubps_avx(auVar96,auVar111);
                    fVar71 = auVar101._0_4_;
                    fVar85 = auVar101._4_4_;
                    fVar87 = auVar101._8_4_;
                    fVar89 = auVar101._12_4_;
                    auVar94._0_4_ = (int)auVar95._0_4_;
                    auVar94._4_4_ = (int)auVar95._4_4_;
                    auVar94._8_4_ = (int)auVar95._8_4_;
                    auVar94._12_4_ = (int)auVar95._12_4_;
                    auVar95 = vpslld_avx(auVar94,0x17);
                    auVar95 = vpaddd_avx(auVar37,auVar95);
                    auVar72._0_4_ =
                         fVar119 + (fVar119 + fVar71 +
                                   (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 +
                                      0.008333452) * fVar71 + 0.041665796) * fVar71 + 0.16666666) *
                                    fVar71 + 0.5) * fVar71 * fVar71) * auVar95._0_4_;
                    auVar72._4_4_ =
                         fVar121 + (fVar121 + fVar85 +
                                   (((((fVar85 * 0.00019875691 + 0.0013981999) * fVar85 +
                                      0.008333452) * fVar85 + 0.041665796) * fVar85 + 0.16666666) *
                                    fVar85 + 0.5) * fVar85 * fVar85) * auVar95._4_4_;
                    auVar72._8_4_ =
                         fVar122 + (fVar122 + fVar87 +
                                   (((((fVar87 * 0.00019875691 + 0.0013981999) * fVar87 +
                                      0.008333452) * fVar87 + 0.041665796) * fVar87 + 0.16666666) *
                                    fVar87 + 0.5) * fVar87 * fVar87) * auVar95._8_4_;
                    auVar72._12_4_ =
                         fVar123 + (fVar123 + fVar89 +
                                   (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 +
                                      0.008333452) * fVar89 + 0.041665796) * fVar89 + 0.16666666) *
                                    fVar89 + 0.5) * fVar89 * fVar89) * auVar95._12_4_;
                    auVar101 = vcmpps_avx(auVar72,(undefined1  [16])0x0,2);
                    auVar46._8_4_ = 0x800000;
                    auVar46._0_8_ = 0x80000000800000;
                    auVar46._12_4_ = 0x800000;
                    auVar95 = vmaxps_avx(auVar72,auVar46);
                    auVar96 = vpsrld_avx(auVar95,0x17);
                    auVar47._8_4_ = 0x807fffff;
                    auVar47._0_8_ = 0x807fffff807fffff;
                    auVar47._12_4_ = 0x807fffff;
                    auVar95 = vandps_avx(auVar95,auVar47);
                    auVar48._8_4_ = 0x3f000000;
                    auVar48._0_8_ = 0x3f0000003f000000;
                    auVar48._12_4_ = 0x3f000000;
                    auVar57 = vorps_avx(auVar95,auVar48);
                    auVar49._8_4_ = 0xffffff82;
                    auVar49._0_8_ = 0xffffff82ffffff82;
                    auVar49._12_4_ = 0xffffff82;
                    auVar95 = vpaddd_avx(auVar96,auVar49);
                    auVar91 = vcvtdq2ps_avx(auVar95);
                    auVar50._8_4_ = 0x3f3504f3;
                    auVar50._0_8_ = 0x3f3504f33f3504f3;
                    auVar50._12_4_ = 0x3f3504f3;
                    auVar96 = vcmpps_avx(auVar57,auVar50,1);
                    auVar95 = vandps_avx(auVar96,auVar57);
                    fVar71 = auVar95._0_4_ + auVar57._0_4_ + -1.0;
                    fVar85 = auVar95._4_4_ + auVar57._4_4_ + -1.0;
                    fVar87 = auVar95._8_4_ + auVar57._8_4_ + -1.0;
                    fVar89 = auVar95._12_4_ + auVar57._12_4_ + -1.0;
                    auVar95 = vandps_avx(auVar37,auVar96);
                    auVar95 = vsubps_avx(auVar91,auVar95);
                    auVar73._0_4_ =
                         (auVar95._0_4_ * 0.6931472 + fVar71 +
                         (((((((((fVar71 * 0.070376836 + -0.1151461) * fVar71 + 0.116769984) *
                                fVar71 + -0.12420141) * fVar71 + 0.14249323) * fVar71 + -0.16668057)
                             * fVar71 + 0.20000714) * fVar71 + -0.24999994) * fVar71 + 0.3333333) *
                          fVar71 + -0.5) * fVar71 * fVar71) * -2.0;
                    auVar73._4_4_ =
                         (auVar95._4_4_ * 0.6931472 + fVar85 +
                         (((((((((fVar85 * 0.070376836 + -0.1151461) * fVar85 + 0.116769984) *
                                fVar85 + -0.12420141) * fVar85 + 0.14249323) * fVar85 + -0.16668057)
                             * fVar85 + 0.20000714) * fVar85 + -0.24999994) * fVar85 + 0.3333333) *
                          fVar85 + -0.5) * fVar85 * fVar85) * -2.0;
                    auVar73._8_4_ =
                         (auVar95._8_4_ * 0.6931472 + fVar87 +
                         (((((((((fVar87 * 0.070376836 + -0.1151461) * fVar87 + 0.116769984) *
                                fVar87 + -0.12420141) * fVar87 + 0.14249323) * fVar87 + -0.16668057)
                             * fVar87 + 0.20000714) * fVar87 + -0.24999994) * fVar87 + 0.3333333) *
                          fVar87 + -0.5) * fVar87 * fVar87) * -2.0;
                    auVar73._12_4_ =
                         (auVar95._12_4_ * 0.6931472 + fVar89 +
                         (((((((((fVar89 * 0.070376836 + -0.1151461) * fVar89 + 0.116769984) *
                                fVar89 + -0.12420141) * fVar89 + 0.14249323) * fVar89 + -0.16668057)
                             * fVar89 + 0.20000714) * fVar89 + -0.24999994) * fVar89 + 0.3333333) *
                          fVar89 + -0.5) * fVar89 * fVar89) * -2.0;
                    auVar51._8_4_ = 0x7fffffff;
                    auVar51._0_8_ = 0x7fffffff7fffffff;
                    auVar51._12_4_ = 0x7fffffff;
                    auVar95 = vblendvps_avx(auVar73,auVar51,auVar101);
                    auVar95 = vminps_avx(auVar125,auVar95);
                    auVar126._8_4_ = 0xc2b0c0a5;
                    auVar126._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar126._12_4_ = 0xc2b0c0a5;
                    auVar96 = vmaxps_avx(auVar126,auVar95);
                    auVar97._0_4_ = auVar96._0_4_ * 1.442695 + 0.5;
                    auVar97._4_4_ = auVar96._4_4_ * 1.442695 + 0.5;
                    auVar97._8_4_ = auVar96._8_4_ * 1.442695 + 0.5;
                    auVar97._12_4_ = auVar96._12_4_ * 1.442695 + 0.5;
                    auVar112._0_4_ = (int)auVar97._0_4_;
                    auVar112._4_4_ = (int)auVar97._4_4_;
                    auVar112._8_4_ = (int)auVar97._8_4_;
                    auVar112._12_4_ = (int)auVar97._12_4_;
                    auVar101 = vcvtdq2ps_avx(auVar112);
                    auVar95 = vcmpps_avx(auVar97,auVar101,1);
                    auVar95 = vandps_avx(auVar37,auVar95);
                    auVar95 = vsubps_avx(auVar101,auVar95);
                    auVar113._0_4_ = auVar95._0_4_ * 0.6931472;
                    auVar113._4_4_ = auVar95._4_4_ * 0.6931472;
                    auVar113._8_4_ = auVar95._8_4_ * 0.6931472;
                    auVar113._12_4_ = auVar95._12_4_ * 0.6931472;
                    auVar101 = vsubps_avx(auVar96,auVar113);
                    fVar71 = auVar101._0_4_;
                    fVar85 = auVar101._4_4_;
                    fVar87 = auVar101._8_4_;
                    fVar89 = auVar101._12_4_;
                    auVar98._0_4_ = (int)auVar95._0_4_;
                    auVar98._4_4_ = (int)auVar95._4_4_;
                    auVar98._8_4_ = (int)auVar95._8_4_;
                    auVar98._12_4_ = (int)auVar95._12_4_;
                    auVar95 = vpslld_avx(auVar98,0x17);
                    auVar95 = vpaddd_avx(auVar37,auVar95);
                    auVar74._0_4_ =
                         fVar119 + (fVar119 + fVar71 +
                                   (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 +
                                      0.008333452) * fVar71 + 0.041665796) * fVar71 + 0.16666666) *
                                    fVar71 + 0.5) * fVar71 * fVar71) * auVar95._0_4_;
                    auVar74._4_4_ =
                         fVar121 + (fVar121 + fVar85 +
                                   (((((fVar85 * 0.00019875691 + 0.0013981999) * fVar85 +
                                      0.008333452) * fVar85 + 0.041665796) * fVar85 + 0.16666666) *
                                    fVar85 + 0.5) * fVar85 * fVar85) * auVar95._4_4_;
                    auVar74._8_4_ =
                         fVar122 + (fVar122 + fVar87 +
                                   (((((fVar87 * 0.00019875691 + 0.0013981999) * fVar87 +
                                      0.008333452) * fVar87 + 0.041665796) * fVar87 + 0.16666666) *
                                    fVar87 + 0.5) * fVar87 * fVar87) * auVar95._8_4_;
                    auVar74._12_4_ =
                         fVar123 + (fVar123 + fVar89 +
                                   (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 +
                                      0.008333452) * fVar89 + 0.041665796) * fVar89 + 0.16666666) *
                                    fVar89 + 0.5) * fVar89 * fVar89) * auVar95._12_4_;
                    auVar95 = vrcpps_avx(auVar74);
                    fVar71 = auVar95._0_4_;
                    fVar85 = auVar95._4_4_;
                    fVar87 = auVar95._8_4_;
                    fVar89 = auVar95._12_4_;
                    auVar75._0_4_ = auVar74._0_4_ * (fVar71 + fVar71);
                    auVar75._4_4_ = auVar74._4_4_ * (fVar85 + fVar85);
                    auVar75._8_4_ = auVar74._8_4_ * (fVar87 + fVar87);
                    auVar75._12_4_ = auVar74._12_4_ * (fVar89 + fVar89);
                    auVar52._8_4_ = 0x40000000;
                    auVar52._0_8_ = 0x4000000040000000;
                    auVar52._12_4_ = 0x40000000;
                    auVar95 = vsubps_avx(auVar52,auVar75);
                    auVar57._0_4_ = (fVar71 + fVar71 + -1.0 + fVar71 * auVar95._0_4_) * fVar22;
                    auVar57._4_4_ = (fVar85 + fVar85 + -1.0 + fVar85 * auVar95._4_4_) * fVar86;
                    auVar57._8_4_ = (fVar87 + fVar87 + -1.0 + fVar87 * auVar95._8_4_) * fVar88;
                    auVar57._12_4_ = (fVar89 + fVar89 + -1.0 + fVar89 * auVar95._12_4_) * fVar90;
                    auVar95 = vminps_avx(auVar125,auVar64);
                    auVar96 = vmaxps_avx(auVar126,auVar95);
                    auVar99._0_4_ = auVar96._0_4_ * 1.442695 + 0.5;
                    auVar99._4_4_ = auVar96._4_4_ * 1.442695 + 0.5;
                    auVar99._8_4_ = auVar96._8_4_ * 1.442695 + 0.5;
                    auVar99._12_4_ = auVar96._12_4_ * 1.442695 + 0.5;
                    auVar114._0_4_ = (int)auVar99._0_4_;
                    auVar114._4_4_ = (int)auVar99._4_4_;
                    auVar114._8_4_ = (int)auVar99._8_4_;
                    auVar114._12_4_ = (int)auVar99._12_4_;
                    auVar101 = vcvtdq2ps_avx(auVar114);
                    auVar95 = vcmpps_avx(auVar99,auVar101,1);
                    auVar95 = vandps_avx(auVar37,auVar95);
                    auVar95 = vsubps_avx(auVar101,auVar95);
                    auVar115._0_4_ = auVar95._0_4_ * 0.6931472;
                    auVar115._4_4_ = auVar95._4_4_ * 0.6931472;
                    auVar115._8_4_ = auVar95._8_4_ * 0.6931472;
                    auVar115._12_4_ = auVar95._12_4_ * 0.6931472;
                    auVar101 = vsubps_avx(auVar96,auVar115);
                    fVar22 = auVar101._0_4_;
                    fVar86 = auVar101._4_4_;
                    fVar88 = auVar101._8_4_;
                    fVar90 = auVar101._12_4_;
                    auVar100._0_4_ = (int)auVar95._0_4_;
                    auVar100._4_4_ = (int)auVar95._4_4_;
                    auVar100._8_4_ = (int)auVar95._8_4_;
                    auVar100._12_4_ = (int)auVar95._12_4_;
                    auVar95 = vpslld_avx(auVar100,0x17);
                    auVar95 = vpaddd_avx(auVar37,auVar95);
                    auVar129._0_4_ =
                         fVar119 + (fVar119 + fVar22 +
                                   (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 +
                                      0.008333452) * fVar22 + 0.041665796) * fVar22 + 0.16666666) *
                                    fVar22 + 0.5) * fVar22 * fVar22) * auVar95._0_4_;
                    auVar129._4_4_ =
                         fVar121 + (fVar121 + fVar86 +
                                   (((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 +
                                      0.008333452) * fVar86 + 0.041665796) * fVar86 + 0.16666666) *
                                    fVar86 + 0.5) * fVar86 * fVar86) * auVar95._4_4_;
                    auVar129._8_4_ =
                         fVar122 + (fVar122 + fVar88 +
                                   (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 +
                                      0.008333452) * fVar88 + 0.041665796) * fVar88 + 0.16666666) *
                                    fVar88 + 0.5) * fVar88 * fVar88) * auVar95._8_4_;
                    auVar129._12_4_ =
                         fVar123 + (fVar123 + fVar90 +
                                   (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 +
                                      0.008333452) * fVar90 + 0.041665796) * fVar90 + 0.16666666) *
                                    fVar90 + 0.5) * fVar90 * fVar90) * auVar95._12_4_;
                    auVar38._8_4_ = 0x800000;
                    auVar38._0_8_ = 0x80000000800000;
                    auVar38._12_4_ = 0x800000;
                    auVar95 = vmaxps_avx(auVar129,auVar38);
                    auVar101 = vpsrld_avx(auVar95,0x17);
                    auVar39._8_4_ = 0x807fffff;
                    auVar39._0_8_ = 0x807fffff807fffff;
                    auVar39._12_4_ = 0x807fffff;
                    auVar95 = vandps_avx(auVar95,auVar39);
                    auVar53._8_4_ = 0x3f000000;
                    auVar53._0_8_ = 0x3f0000003f000000;
                    auVar53._12_4_ = 0x3f000000;
                    auVar91 = vorps_avx(auVar95,auVar53);
                    auVar40._8_4_ = 0xffffff82;
                    auVar40._0_8_ = 0xffffff82ffffff82;
                    auVar40._12_4_ = 0xffffff82;
                    auVar95 = vpaddd_avx(auVar101,auVar40);
                    auVar96 = vcvtdq2ps_avx(auVar95);
                    auVar41._8_4_ = 0x3f3504f3;
                    auVar41._0_8_ = 0x3f3504f33f3504f3;
                    auVar41._12_4_ = 0x3f3504f3;
                    auVar101 = vcmpps_avx(auVar91,auVar41,1);
                    auVar95 = vandps_avx(auVar101,auVar91);
                    fVar22 = auVar95._0_4_ + auVar91._0_4_ + -1.0;
                    fVar86 = auVar95._4_4_ + auVar91._4_4_ + -1.0;
                    fVar88 = auVar95._8_4_ + auVar91._8_4_ + -1.0;
                    fVar90 = auVar95._12_4_ + auVar91._12_4_ + -1.0;
                    auVar95 = vandps_avx(auVar37,auVar101);
                    auVar101 = vsubps_avx(auVar96,auVar95);
                    auVar95 = vcmpps_avx(auVar129,(undefined1  [16])0x0,2);
                    auVar76._0_4_ =
                         (auVar101._0_4_ * 0.6931472 + fVar22 +
                         (((((((((fVar22 * 0.070376836 + -0.1151461) * fVar22 + 0.116769984) *
                                fVar22 + -0.12420141) * fVar22 + 0.14249323) * fVar22 + -0.16668057)
                             * fVar22 + 0.20000714) * fVar22 + -0.24999994) * fVar22 + 0.3333333) *
                          fVar22 + -0.5) * fVar22 * fVar22) * -2.0;
                    auVar76._4_4_ =
                         (auVar101._4_4_ * 0.6931472 + fVar86 +
                         (((((((((fVar86 * 0.070376836 + -0.1151461) * fVar86 + 0.116769984) *
                                fVar86 + -0.12420141) * fVar86 + 0.14249323) * fVar86 + -0.16668057)
                             * fVar86 + 0.20000714) * fVar86 + -0.24999994) * fVar86 + 0.3333333) *
                          fVar86 + -0.5) * fVar86 * fVar86) * -2.0;
                    auVar76._8_4_ =
                         (auVar101._8_4_ * 0.6931472 + fVar88 +
                         (((((((((fVar88 * 0.070376836 + -0.1151461) * fVar88 + 0.116769984) *
                                fVar88 + -0.12420141) * fVar88 + 0.14249323) * fVar88 + -0.16668057)
                             * fVar88 + 0.20000714) * fVar88 + -0.24999994) * fVar88 + 0.3333333) *
                          fVar88 + -0.5) * fVar88 * fVar88) * -2.0;
                    auVar76._12_4_ =
                         (auVar101._12_4_ * 0.6931472 + fVar90 +
                         (((((((((fVar90 * 0.070376836 + -0.1151461) * fVar90 + 0.116769984) *
                                fVar90 + -0.12420141) * fVar90 + 0.14249323) * fVar90 + -0.16668057)
                             * fVar90 + 0.20000714) * fVar90 + -0.24999994) * fVar90 + 0.3333333) *
                          fVar90 + -0.5) * fVar90 * fVar90) * -2.0;
                    auVar42._8_4_ = 0x7fffffff;
                    auVar42._0_8_ = 0x7fffffff7fffffff;
                    auVar42._12_4_ = 0x7fffffff;
                    auVar95 = vblendvps_avx(auVar76,auVar42,auVar95);
                    auVar43._8_4_ = 0x42b0c0a5;
                    auVar43._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar43._12_4_ = 0x42b0c0a5;
                    auVar95 = vminps_avx(auVar95,auVar43);
                    auVar44._8_4_ = 0xc2b0c0a5;
                    auVar44._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar44._12_4_ = 0xc2b0c0a5;
                    auVar96 = vmaxps_avx(auVar95,auVar44);
                    auVar102._0_4_ = auVar96._0_4_ * 1.442695 + 0.5;
                    auVar102._4_4_ = auVar96._4_4_ * 1.442695 + 0.5;
                    auVar102._8_4_ = auVar96._8_4_ * 1.442695 + 0.5;
                    auVar102._12_4_ = auVar96._12_4_ * 1.442695 + 0.5;
                    auVar116._0_4_ = (int)auVar102._0_4_;
                    auVar116._4_4_ = (int)auVar102._4_4_;
                    auVar116._8_4_ = (int)auVar102._8_4_;
                    auVar116._12_4_ = (int)auVar102._12_4_;
                    auVar101 = vcvtdq2ps_avx(auVar116);
                    auVar95 = vcmpps_avx(auVar102,auVar101,1);
                    auVar95 = vandps_avx(auVar37,auVar95);
                    auVar95 = vsubps_avx(auVar101,auVar95);
                    auVar117._0_4_ = auVar95._0_4_ * 0.6931472;
                    auVar117._4_4_ = auVar95._4_4_ * 0.6931472;
                    auVar117._8_4_ = auVar95._8_4_ * 0.6931472;
                    auVar117._12_4_ = auVar95._12_4_ * 0.6931472;
                    auVar45 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000))
                                      );
                    auVar101 = vsubps_avx(auVar96,auVar117);
                    fVar22 = auVar101._0_4_;
                    fVar86 = auVar101._4_4_;
                    fVar88 = auVar101._8_4_;
                    fVar90 = auVar101._12_4_;
                    auVar103._0_4_ = (int)auVar95._0_4_;
                    auVar103._4_4_ = (int)auVar95._4_4_;
                    auVar103._8_4_ = (int)auVar95._8_4_;
                    auVar103._12_4_ = (int)auVar95._12_4_;
                    auVar95 = vpslld_avx(auVar103,0x17);
                    auVar37 = vpaddd_avx(auVar37,auVar95);
                    auVar77._0_4_ =
                         fVar119 + (fVar119 + fVar22 +
                                   (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 +
                                      0.008333452) * fVar22 + 0.041665796) * fVar22 + 0.16666666) *
                                    fVar22 + 0.5) * fVar22 * fVar22) * auVar37._0_4_;
                    auVar77._4_4_ =
                         fVar121 + (fVar121 + fVar86 +
                                   (((((fVar86 * 0.00019875691 + 0.0013981999) * fVar86 +
                                      0.008333452) * fVar86 + 0.041665796) * fVar86 + 0.16666666) *
                                    fVar86 + 0.5) * fVar86 * fVar86) * auVar37._4_4_;
                    auVar77._8_4_ =
                         fVar122 + (fVar122 + fVar88 +
                                   (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 +
                                      0.008333452) * fVar88 + 0.041665796) * fVar88 + 0.16666666) *
                                    fVar88 + 0.5) * fVar88 * fVar88) * auVar37._8_4_;
                    auVar77._12_4_ =
                         fVar123 + (fVar123 + fVar90 +
                                   (((((fVar90 * 0.00019875691 + 0.0013981999) * fVar90 +
                                      0.008333452) * fVar90 + 0.041665796) * fVar90 + 0.16666666) *
                                    fVar90 + 0.5) * fVar90 * fVar90) * auVar37._12_4_;
                    auVar37 = vrcpps_avx(auVar77);
                    fVar22 = auVar37._0_4_;
                    fVar86 = auVar37._4_4_;
                    fVar88 = auVar37._8_4_;
                    fVar90 = auVar37._12_4_;
                    auVar78._0_4_ = auVar77._0_4_ * (fVar22 + fVar22);
                    auVar78._4_4_ = auVar77._4_4_ * (fVar86 + fVar86);
                    auVar78._8_4_ = auVar77._8_4_ * (fVar88 + fVar88);
                    auVar78._12_4_ = auVar77._12_4_ * (fVar90 + fVar90);
                    auVar54._8_4_ = 0x40000000;
                    auVar54._0_8_ = 0x4000000040000000;
                    auVar54._12_4_ = 0x40000000;
                    auVar95 = vsubps_avx(auVar54,auVar78);
                    auVar37._0_4_ = fVar22 + fVar22 + -1.0 + fVar22 * auVar95._0_4_;
                    auVar37._4_4_ = fVar86 + fVar86 + -1.0 + fVar86 * auVar95._4_4_;
                    auVar37._8_4_ = fVar88 + fVar88 + -1.0 + fVar88 * auVar95._8_4_;
                    auVar37._12_4_ = fVar90 + fVar90 + -1.0 + fVar90 * auVar95._12_4_;
                    goto LAB_0028b773;
                  case 6:
                    fVar119 = **(float **)(&this->field_0x118 + (long)p_Var14);
                    fVar121 = (*(float **)(&this->field_0x118 + (long)p_Var14))[1];
                    auVar118._0_4_ = fVar119 * fVar22 + fVar121;
                    auVar118._4_4_ = fVar119 * fVar86 + fVar121;
                    auVar118._8_4_ = fVar119 * fVar88 + fVar121;
                    auVar118._12_4_ = fVar119 * fVar90 + fVar121;
                    auVar95 = vmaxps_avx(auVar118,(undefined1  [16])0x0);
                    auVar95 = vminps_avx(auVar37,auVar95);
                    auVar57._0_4_ = auVar95._0_4_ * fVar22;
                    auVar57._4_4_ = auVar95._4_4_ * fVar86;
                    auVar57._8_4_ = auVar95._8_4_ * fVar88;
                    auVar57._12_4_ = auVar95._12_4_ * fVar90;
                    auVar84._0_4_ = fVar119 * auVar64._0_4_ + fVar121;
                    auVar84._4_4_ = fVar119 * fVar36 + fVar121;
                    auVar84._8_4_ = fVar119 * fVar56 + fVar121;
                    auVar84._12_4_ = fVar119 * fVar5 + fVar121;
                    auVar95 = vmaxps_avx(auVar84,(undefined1  [16])0x0);
                    auVar37 = vminps_avx(auVar37,auVar95);
LAB_0028b773:
                    auVar64._0_4_ = auVar37._0_4_ * auVar64._0_4_;
                    auVar64._4_4_ = auVar37._4_4_ * fVar36;
                    auVar64._8_4_ = auVar37._8_4_ * fVar56;
                    auVar64._12_4_ = auVar37._12_4_ * fVar5;
                  }
                  if (iVar33 < 0x65) {
                    *pauVar29 = auVar57;
                    pauVar29[1] = auVar64;
                    pauVar29 = pauVar29 + 2;
                  }
                  else {
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var14) +
                                      (long)local_298 * 0x20);
                    auVar61._0_4_ = auVar57._0_4_ * *pfVar1;
                    auVar61._4_4_ = auVar57._4_4_ * pfVar1[1];
                    auVar61._8_4_ = auVar57._8_4_ * pfVar1[2];
                    auVar61._12_4_ = auVar57._12_4_ * pfVar1[3];
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var14) + 0x10 +
                                      (long)local_298 * 0x20);
                    auVar68._0_4_ = auVar64._0_4_ * *pfVar1;
                    auVar68._4_4_ = auVar64._4_4_ * pfVar1[1];
                    auVar68._8_4_ = auVar64._8_4_ * pfVar1[2];
                    auVar68._12_4_ = auVar64._12_4_ * pfVar1[3];
                    auVar55._8_4_ = 0x80000000;
                    auVar55._0_8_ = 0x8000000080000000;
                    auVar55._12_4_ = 0x80000000;
                    auVar37 = vandps_avx(auVar61,auVar55);
                    auVar95 = vandps_avx(auVar68,auVar55);
                    auVar37 = vorps_avx(auVar37,auVar45._0_16_);
                    auVar95 = vorps_avx(auVar95,auVar45._0_16_);
                    auVar62._0_4_ = (int)(auVar61._0_4_ + auVar37._0_4_);
                    auVar62._4_4_ = (int)(auVar61._4_4_ + auVar37._4_4_);
                    auVar62._8_4_ = (int)(auVar61._8_4_ + auVar37._8_4_);
                    auVar62._12_4_ = (int)(auVar61._12_4_ + auVar37._12_4_);
                    auVar69._0_4_ = (int)(auVar68._0_4_ + auVar95._0_4_);
                    auVar69._4_4_ = (int)(auVar68._4_4_ + auVar95._4_4_);
                    auVar69._8_4_ = (int)(auVar68._8_4_ + auVar95._8_4_);
                    auVar69._12_4_ = (int)(auVar68._12_4_ + auVar95._12_4_);
                    auVar37 = vpackssdw_avx(auVar62,auVar69);
                    auVar37 = vpminsw_avx(auVar37,_DAT_00315ee0);
                    auVar37 = vpmaxsw_avx(auVar37,_DAT_00315ef0);
                    auVar37 = vpacksswb_avx(auVar37,auVar37);
                    *(long *)*pauVar26 = auVar37._0_8_;
                    pauVar26 = (undefined1 (*) [16])((long)*pauVar26 + 8);
                  }
                  bVar35 = iVar19 != iVar16;
                  iVar19 = iVar19 + 1;
                } while (bVar35);
              }
              uVar31 = (ulong)(iVar21 + 1);
            } while (iVar21 != (int)local_238);
          }
          local_298 = (void *)((long)local_298 + 1);
          local_2b0 = (ulong)(uint)((int)local_2b0 + iVar28);
        } while (local_298 != local_2a0);
      }
      if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
        uVar34 = local_2f8._16_8_ - local_2f8._0_8_;
        pfVar24 = (pointer)local_2f8._0_8_;
LAB_0028c796:
        operator_delete(pfVar24,uVar34);
      }
    }
    iVar18 = 0;
    goto LAB_0028c887;
  }
  local_290 = 1;
  if ((*(uint *)(&this->field_0xd0 + (long)p_Var14) & 3) == 0) {
    local_290 = (ulong)opt->use_packing_layout * 3 + 1;
  }
  iVar16 = (int)local_290;
  uVar34 = (ulong)(uint)(iVar16 * 4);
  if (100 < *(int *)(&this->field_0x10c + (long)p_Var14)) {
    uVar34 = local_290;
  }
  local_2b0 = CONCAT44(local_2b0._4_4_,iVar28);
  Mat::create(top_blob,iVar21,iVar28,(int)*(uint *)(&this->field_0xd0 + (long)p_Var14) / iVar16,
              uVar34,iVar16,opt->blob_allocator);
  uVar31 = local_290;
  auVar10 = stack0xfffffffffffffd28;
  iVar18 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0028c887;
  uVar20 = (int)uVar20 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
  uVar13 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
  local_2a8 = (float *)CONCAT44(local_2a8._4_4_,uVar13);
  iVar16 = 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    iVar16 = 1;
    if ((uVar20 & 7) == 0) {
      iVar16 = 8;
    }
    _elempack = (uint)((uVar13 & 3) == 0) * 3 + 1;
  }
  piVar3 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  local_2f8._12_4_ = local_228.refcount._4_4_;
  local_2f8._8_4_ = local_228.refcount._0_4_;
  local_2f8._0_8_ = local_228.data;
  local_2f8._16_8_ = local_228.elemsize;
  local_2f8._24_4_ = local_228.elempack;
  uStack_2d0._4_4_ = local_228.w;
  uStack_2d0._0_4_ = local_228.dims;
  uStack_2c8._4_4_ = local_228.d;
  uStack_2c8._0_4_ = local_228.h;
  local_2f8._32_8_ = local_228.allocator;
  uStack_2bc = auVar10._28_4_;
  iStack_2c0 = local_228.c;
  local_2b8 = local_228.cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (iVar16 < iVar19) {
    local_288.data = *(void **)opt;
    local_288.elemsize = (size_t)opt->workspace_allocator;
    local_288.elempack = opt->openmp_blocktime;
    local_288._28_1_ = opt->use_winograd_convolution;
    local_288._29_1_ = opt->use_sgemm_convolution;
    local_288._30_1_ = opt->use_int8_inference;
    local_288._31_1_ = opt->use_vulkan_compute;
    local_288.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_288._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_288._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_288._56_8_ = *(undefined8 *)&opt->use_reserved_4;
    local_288.refcount = (int *)opt->workspace_allocator;
    convert_packing(&local_228,(Mat *)local_2f8,iVar16,(Option *)&local_288);
  }
  piVar3 = top_blob->refcount;
  local_288.data = top_blob->data;
  local_288.refcount = top_blob->refcount;
  local_288.elemsize = top_blob->elemsize;
  local_288.elempack = top_blob->elempack;
  local_288.allocator = top_blob->allocator;
  local_288.dims = top_blob->dims;
  local_288.w = top_blob->w;
  local_288.h = top_blob->h;
  local_288.d = top_blob->d;
  local_288.c = top_blob->c;
  local_288.cstep = top_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx;
  if (_elempack < (uint)uVar31) {
    Mat::create(&local_288,iVar21,(int)local_2b0,
                *(int *)(&this->field_0xd0 + (long)pp_Var15[-3]) / (int)_elempack,
                (ulong)((byte)(((ushort)uVar34 & 0xff) / (ushort)(byte)uVar31) * _elempack),
                _elempack,opt->workspace_allocator);
    iVar18 = -100;
    if ((local_288.data != (void *)0x0) && ((long)local_288.c * local_288.cstep != 0)) {
      pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx;
      goto LAB_0028bb07;
    }
  }
  else {
LAB_0028bb07:
    if (0 < *(int *)(&this->field_0x108 + (long)pp_Var15[-3])) {
      iVar21 = (int)local_2a8 / (int)_elempack;
      iVar28 = 0;
      iVar33 = 0;
      lVar27 = 0;
      do {
        if ((int)uStack_2d0 == 3) {
          local_1a8 = 3;
          lVar32 = (long)(int)uStack_2c8 * (long)uStack_2d0._4_4_ * local_2f8._16_8_;
          local_19c = 1;
        }
        else {
          local_1a8 = 4;
          lVar32 = (long)(int)uStack_2c8 * (long)uStack_2d0._4_4_ *
                   (long)uStack_2c8._4_4_ * local_2f8._16_8_;
          local_19c = uStack_2c8._4_4_;
        }
        local_1d0 = (pointer)((long)(iVar28 / iVar16) * local_2b8 * local_2f8._16_8_ +
                             local_2f8._0_8_);
        local_1a4 = uStack_2d0._4_4_;
        local_1b0 = (Allocator *)local_2f8._32_8_;
        local_1b8 = local_2f8._24_4_;
        local_1c8 = (int *)0x0;
        local_1c0 = (Allocator *)local_2f8._16_8_;
        local_190 = (lVar32 + 0xfU & 0xfffffffffffffff0) / (ulong)local_2f8._16_8_;
        local_1a0 = (int)uStack_2c8;
        if (local_288.dims == 3) {
          local_160 = 3;
          lVar32 = (long)local_288.h * (long)local_288.w * local_288.elemsize;
          local_154 = 1;
        }
        else {
          local_160 = 4;
          lVar32 = (long)local_288.h * (long)local_288.w * (long)local_288.d * local_288.elemsize;
          local_154 = local_288.d;
        }
        local_188 = (void *)((long)(iVar33 / (int)_elempack) * local_288.cstep * local_288.elemsize
                            + (long)local_288.data);
        local_15c = local_288.w;
        local_168 = local_288.allocator;
        local_170 = local_288.elempack;
        local_180 = (int *)0x0;
        local_178 = local_288.elemsize;
        local_148 = (lVar32 + 0xfU & 0xfffffffffffffff0) / local_288.elemsize;
        local_158 = local_288.h;
        pLVar4 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar27];
        local_78._0_1_ = opt->lightmode;
        local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
        local_78._4_4_ = opt->num_threads;
        pAStack_68 = opt->workspace_allocator;
        uStack_60._0_4_ = opt->openmp_blocktime;
        uStack_60._4_1_ = opt->use_winograd_convolution;
        uStack_60._5_1_ = opt->use_sgemm_convolution;
        uStack_60._6_1_ = opt->use_int8_inference;
        uStack_60._7_1_ = opt->use_vulkan_compute;
        local_58._0_1_ = opt->use_bf16_storage;
        local_58._1_1_ = opt->use_fp16_packed;
        local_58._2_1_ = opt->use_fp16_storage;
        local_58._3_1_ = opt->use_fp16_arithmetic;
        local_58._4_1_ = opt->use_int8_packed;
        local_58._5_1_ = opt->use_int8_storage;
        local_58._6_1_ = opt->use_int8_arithmetic;
        local_58._7_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_50._4_1_ = opt->use_subgroup_shuffle;
        uStack_50._5_1_ = opt->use_image_storage;
        uStack_50._6_1_ = opt->use_tensor_storage;
        uStack_50._7_1_ = opt->use_weight_fp16_storage;
        uStack_48._0_4_ = opt->flush_denormals;
        uStack_48._4_1_ = opt->use_local_pool_allocator;
        uStack_48._5_1_ = opt->use_reserved_1;
        uStack_48._6_1_ = opt->use_reserved_2;
        uStack_48._7_1_ = opt->use_reserved_3;
        uStack_40._0_1_ = opt->use_reserved_4;
        uStack_40._1_1_ = opt->use_reserved_5;
        uStack_40._2_1_ = opt->use_reserved_6;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_40._4_1_ = opt->use_reserved_8;
        uStack_40._5_1_ = opt->use_reserved_9;
        uStack_40._6_1_ = opt->use_reserved_10;
        uStack_40._7_1_ = opt->use_reserved_11;
        pAStack_70 = top_blob->allocator;
        local_198 = (int)uVar20 / iVar16;
        local_150 = iVar21;
        (*pLVar4->_vptr_Layer[7])(pLVar4,&local_1d0,&local_188,&local_78);
        if (local_180 != (int *)0x0) {
          LOCK();
          *local_180 = *local_180 + -1;
          UNLOCK();
          if (*local_180 == 0) {
            if (local_168 == (Allocator *)0x0) {
              if (local_188 != (void *)0x0) {
                free(local_188);
              }
            }
            else {
              (*local_168->_vptr_Allocator[3])();
            }
          }
        }
        if (local_1c8 != (int *)0x0) {
          LOCK();
          *local_1c8 = *local_1c8 + -1;
          UNLOCK();
          if (*local_1c8 == 0) {
            if (local_1b0 == (Allocator *)0x0) {
              if (local_1d0 != (pointer)0x0) {
                free(local_1d0);
              }
            }
            else {
              (*local_1b0->_vptr_Allocator[3])();
            }
          }
        }
        lVar27 = lVar27 + 1;
        iVar33 = iVar33 + (int)local_2a8;
        iVar28 = iVar28 + uVar20;
      } while (lVar27 < *(int *)(&this->field_0x108 +
                                (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
    }
    if (_elempack < (uint)local_290) {
      convert_packing(&local_288,top_blob,(uint)local_290,opt);
      iVar18 = 0;
    }
    else {
      iVar18 = 0;
      if (&local_288 != top_blob) {
        if (local_288.refcount != (int *)0x0) {
          LOCK();
          *local_288.refcount = *local_288.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        iVar18 = 0;
        top_blob->data = local_288.data;
        top_blob->refcount = local_288.refcount;
        top_blob->elemsize = local_288.elemsize;
        top_blob->elempack = local_288.elempack;
        top_blob->allocator = local_288.allocator;
        top_blob->dims = local_288.dims;
        top_blob->w = local_288.w;
        top_blob->h = local_288.h;
        top_blob->d = local_288.d;
        top_blob->c = local_288.c;
        top_blob->cstep = local_288.cstep;
      }
    }
  }
  if (local_288.refcount != (int *)0x0) {
    LOCK();
    *local_288.refcount = *local_288.refcount + -1;
    UNLOCK();
    if (*local_288.refcount == 0) {
      if (local_288.allocator == (Allocator *)0x0) {
        if (local_288.data != (void *)0x0) {
          free(local_288.data);
        }
      }
      else {
        (*(local_288.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if ((Allocator *)local_2f8._8_8_ != (Allocator *)0x0) {
    LOCK();
    *(int *)(_func_int ***)local_2f8._8_8_ = *(int *)(_func_int ***)local_2f8._8_8_ + -1;
    UNLOCK();
    if (*(int *)(_func_int ***)local_2f8._8_8_ == 0) {
      if ((Allocator *)local_2f8._32_8_ == (Allocator *)0x0) {
        if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
          free((void *)local_2f8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_2f8._32_8_)[3])();
      }
    }
  }
LAB_0028c887:
  piVar3 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        if (local_228.data != (void *)0x0) {
          free(local_228.data);
        }
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_138.refcount != (int *)0x0) {
    LOCK();
    *local_138.refcount = *local_138.refcount + -1;
    UNLOCK();
    if (*local_138.refcount == 0) {
      if (local_138.allocator == (Allocator *)0x0) {
        if (local_138.data != (void *)0x0) {
          free(local_138.data);
        }
      }
      else {
        (*(local_138.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int ConvolutionDepthWise_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_int8 + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}